

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::save
          (section_impl<ELFIO::Elf64_Shdr> *this,ostream *f,streampos header_offset,
          streampos data_offset)

{
  streampos data_offset_00;
  streampos header_offset_00;
  uint uVar1;
  int iVar2;
  Elf64_Off EVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  ostream *f_local;
  section_impl<ELFIO::Elf64_Shdr> *this_local;
  streampos data_offset_local;
  streampos header_offset_local;
  
  data_offset_local._M_off = (streamoff)data_offset._M_state;
  this_local = (section_impl<ELFIO::Elf64_Shdr> *)data_offset._M_off;
  data_offset_local._M_state = (__mbstate_t)header_offset._M_off;
  uVar1 = (*(this->super_section)._vptr_section[2])();
  if ((uVar1 & 0xffff) != 0) {
    EVar3 = std::fpos::operator_cast_to_long((fpos *)&this_local);
    (this->header).sh_offset = EVar3;
    uVar4 = endianess_convertor::operator()(&this->convertor,(this->header).sh_offset);
    (this->header).sh_offset = uVar4;
  }
  header_offset_00._M_state = header_offset._M_state;
  header_offset_00._M_off._0_4_ = data_offset_local._M_state.__count;
  header_offset_00._M_off._4_4_ = data_offset_local._M_state.__value;
  save_header(this,f,header_offset_00);
  iVar2 = (*(this->super_section)._vptr_section[5])();
  if (iVar2 != 8) {
    iVar2 = (*(this->super_section)._vptr_section[5])();
    if (iVar2 != 0) {
      iVar2 = (*(this->super_section)._vptr_section[0x13])();
      if ((CONCAT44(extraout_var,iVar2) != 0) && (this->data != (char *)0x0)) {
        data_offset_00._M_state.__count = (undefined4)data_offset_local._M_off;
        data_offset_00._M_state.__value =
             (anon_union_4_2_91654ee9_for___value)data_offset_local._M_off._4_4_;
        data_offset_00._M_off = (streamoff)this_local;
        save_data(this,f,data_offset_00);
      }
    }
  }
  return;
}

Assistant:

void
    save( std::ostream&  f,
          std::streampos header_offset,
          std::streampos data_offset )
    {
        if ( 0 != get_index() ) {
            header.sh_offset = data_offset;
            header.sh_offset = convertor( header.sh_offset );
        }

        save_header( f, header_offset );
        if ( get_type() != SHT_NOBITS && get_type() != SHT_NULL &&
             get_size() != 0 && data != 0 ) {
            save_data( f, data_offset );
        }
    }